

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_iload(ExecutionEngine *this)

{
  u2 uVar1;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar2;
  Value operand;
  ValueType VStack_3c;
  Value value;
  u1 byte2;
  int16_t index;
  u1 byte1;
  u1 *code;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  puVar2 = Frame::getCode(this_01,this_01->pc);
  value.data.longValue._4_2_ = ZEXT12(puVar2[1]);
  if ((this->_isWide & 1U) == 0) {
    this_01->pc = this_01->pc + 2;
  }
  else {
    value.data.longValue._4_2_ = CONCAT11(puVar2[1],puVar2[2]);
    this_01->pc = this_01->pc + 3;
    this->_isWide = false;
  }
  uVar1 = Frame::sizeLocalVariables(this_01);
  if (value.data._4_2_ < (short)uVar1) {
    operand = Frame::getLocalVariableValue(this_01,(int)(short)value.data.longValue._4_2_);
    VStack_3c = operand.type;
    if (VStack_3c == INT) {
      Frame::pushIntoOperandStack(this_01,operand);
      return;
    }
    __assert_fail("value.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x210,"void ExecutionEngine::i_iload()");
  }
  __assert_fail("((int16_t)(topFrame->sizeLocalVariables()) > index)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x20e,"void ExecutionEngine::i_iload()");
}

Assistant:

void ExecutionEngine::i_iload() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	u1 *code = topFrame->getCode(topFrame->pc);
	u1 byte1 = code[1]; //índice do vetor de variáveis locais
	int16_t index = (int16_t)byte1;

	if (_isWide) {
		u1 byte2 = code[2];
		index = (byte1 << 8) | byte2;
		topFrame->pc += 3;
		_isWide = false;
	}
	else {
		topFrame->pc += 2;
	}

	assert(((int16_t)(topFrame->sizeLocalVariables()) > index));
	Value value = topFrame->getLocalVariableValue(index);
	assert(value.type == ValueType::INT);

	topFrame->pushIntoOperandStack(value);
}